

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bond.hpp
# Opt level: O1

void __thiscall OpenMD::Bond::Bond(Bond *this,Atom *atom1,Atom *atom2,BondType *bt)

{
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *this_00;
  
  ShortRangeInteraction::ShortRangeInteraction(&this->super_ShortRangeInteraction);
  (this->super_ShortRangeInteraction)._vptr_ShortRangeInteraction =
       (_func_int **)&PTR__Bond_002523d8;
  this->potential_ = 0.0;
  this->bondType_ = bt;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  this_00 = &(this->super_ShortRangeInteraction).atoms_;
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::resize(this_00,2);
  *(this_00->super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>)._M_impl.
   super__Vector_impl_data._M_start = atom1;
  (this_00->super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>)._M_impl.
  super__Vector_impl_data._M_start[1] = atom2;
  return;
}

Assistant:

Bond(Atom* atom1, Atom* atom2, BondType* bt) :
        ShortRangeInteraction(), bondType_(bt) {
      atoms_.resize(2);
      atoms_[0] = atom1;
      atoms_[1] = atom2;
    }